

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMerge.c
# Opt level: O2

void Amap_ManMergeNodeCuts(Amap_Man_t *p,Amap_Obj_t *pNode)

{
  uint uVar1;
  Amap_Cut_t AVar2;
  uint uVar3;
  int iVar4;
  Amap_Obj_t *pAVar5;
  Amap_Obj_t *pAVar6;
  long lVar7;
  int *piVar8;
  int iVar9;
  Amap_Cut_t *pCut1;
  uint uVar10;
  Amap_Cut_t *pAVar11;
  Amap_Cut_t *pCut0;
  uint uVar12;
  Amap_Cut_t *pAVar13;
  int iVar14;
  int local_74;
  
  pAVar5 = Amap_ObjFanin0(p,pNode);
  pAVar6 = Amap_ObjFanin1(p,pNode);
  if ((pNode->field_11).pData != (void *)0x0) {
    __assert_fail("pNode->pData == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapMerge.c"
                  ,0x1c1,"void Amap_ManMergeNodeCuts(Amap_Man_t *, Amap_Obj_t *)");
  }
  if ((*(uint *)pNode & 7) == 4) {
    lVar7 = 0x80;
  }
  else {
    if ((*(uint *)pNode & 7) == 6) {
      Amap_ManMergeNodeCutsMux(p,pNode);
      return;
    }
    lVar7 = 0x88;
  }
  lVar7 = *(long *)((long)&p->pLib->pName + lVar7);
  pAVar13 = (Amap_Cut_t *)(pAVar5->field_11).pData;
  for (iVar9 = 0; iVar9 < (int)pAVar5->nCuts; iVar9 = iVar9 + 1) {
    uVar10 = (uint)*pAVar13 >> 0x10 & 1;
    uVar1 = Amap_ObjFaninC0(pNode);
    AVar2 = *pAVar13;
    if (((uint)AVar2 & 0xffff) == 0) {
      local_74 = 0;
    }
    else {
      local_74 = Abc_Var2Lit((uint)AVar2 & 0xffff,uVar10 ^ uVar1);
      AVar2 = *pAVar13;
    }
    if (uVar10 != uVar1 && ((uint)AVar2 & 0xfffe0000) == 0x20000) {
      AVar2 = (Amap_Cut_t)Abc_LitNot((int)pAVar13[1]);
      pAVar13[1] = AVar2;
    }
    for (piVar8 = *(int **)(lVar7 + (long)local_74 * 8); iVar14 = *piVar8, iVar14 != 0;
        piVar8 = piVar8 + 1) {
      p->pMatsTemp[(ushort)iVar14] = iVar14 >> 0x10;
    }
    pAVar11 = (Amap_Cut_t *)(pAVar6->field_11).pData;
    for (iVar14 = 0; iVar14 < (int)pAVar6->nCuts; iVar14 = iVar14 + 1) {
      uVar12 = (uint)*pAVar11 >> 0x10 & 1;
      uVar3 = Amap_ObjFaninC1(pNode);
      AVar2 = *pAVar11;
      if (((uint)AVar2 & 0xffff) == 0) {
        iVar4 = 0;
      }
      else {
        iVar4 = Abc_Var2Lit((uint)AVar2 & 0xffff,uVar12 ^ uVar3);
        AVar2 = *pAVar11;
      }
      if (p->pMatsTemp[iVar4] != 0) {
        if (uVar12 != uVar3 && ((uint)AVar2 & 0xfffe0000) == 0x20000) {
          AVar2 = (Amap_Cut_t)Abc_LitNot((int)pAVar11[1]);
          pAVar11[1] = AVar2;
        }
        pCut1 = pAVar11;
        pCut0 = pAVar13;
        if (local_74 < iVar4) {
          pCut1 = pAVar13;
          pCut0 = pAVar11;
        }
        Amap_ManCutCreate(p,pCut0,pCut1,p->pMatsTemp[iVar4]);
        AVar2 = *pAVar11;
        if (((uint)AVar2 & 0xfffe0000) == 0x20000 && uVar12 != uVar3) {
          AVar2 = (Amap_Cut_t)Abc_LitNot((int)pAVar11[1]);
          pAVar11[1] = AVar2;
          AVar2 = *pAVar11;
        }
      }
      pAVar11 = pAVar11 + (ulong)((uint)AVar2 >> 0x11) + 1;
    }
    if (((uint)*pAVar13 & 0xfffe0000) == 0x20000 && uVar10 != uVar1) {
      AVar2 = (Amap_Cut_t)Abc_LitNot((int)pAVar13[1]);
      pAVar13[1] = AVar2;
    }
    for (piVar8 = *(int **)(lVar7 + (long)local_74 * 8); *piVar8 != 0; piVar8 = piVar8 + 1) {
      p->pMatsTemp[(ushort)*piVar8] = 0;
    }
    pAVar13 = pAVar13 + (ulong)((uint)*pAVar13 >> 0x11) + 1;
  }
  Amap_ManCutSaveStored(p,pNode);
  p->nCutsUsed = p->nCutsUsed + pNode->nCuts;
  p->nCutsTried = p->nCutsTried + pAVar6->nCuts * pAVar5->nCuts;
  if ((pNode->field_0x7 & 0x40) != 0) {
    Amap_ManMergeNodeChoice(p,pNode);
    return;
  }
  return;
}

Assistant:

void Amap_ManMergeNodeCuts( Amap_Man_t * p, Amap_Obj_t * pNode )
{
    Amap_Obj_t * pFanin0 = Amap_ObjFanin0( p, pNode );
    Amap_Obj_t * pFanin1 = Amap_ObjFanin1( p, pNode );
    Amap_Cut_t * pCut0, * pCut1;
    int ** pRules, Entry, i, k, c, iCompl0, iCompl1, iFan0, iFan1;
    assert( pNode->pData == NULL );
    if ( pNode->Type == AMAP_OBJ_MUX )
    {
        Amap_ManMergeNodeCutsMux( p, pNode );
        return;
    }
    assert( pNode->Type != AMAP_OBJ_MUX );
    pRules = (pNode->Type == AMAP_OBJ_AND)? p->pLib->pRules: p->pLib->pRulesX;
    Amap_NodeForEachCut( pFanin0, pCut0, c )
    {
        iCompl0 = pCut0->fInv ^ Amap_ObjFaninC0(pNode);
        iFan0   = !pCut0->iMat? 0: Abc_Var2Lit( pCut0->iMat, iCompl0 );
        // complement literals
        if ( pCut0->nFans == 1 && iCompl0 )
            pCut0->Fans[0] = Abc_LitNot(pCut0->Fans[0]);
        // label resulting sets
        for ( i = 0; (Entry = pRules[iFan0][i]); i++ )
            p->pMatsTemp[Entry & 0xffff] = (Entry >> 16);
        // iterate through the cuts
        Amap_NodeForEachCut( pFanin1, pCut1, k )
        {
            iCompl1 = pCut1->fInv ^ Amap_ObjFaninC1(pNode);
            iFan1   = !pCut1->iMat? 0: Abc_Var2Lit( pCut1->iMat, iCompl1 );
            if ( p->pMatsTemp[iFan1] == 0 )
                continue;
            // complement literals
            if ( pCut1->nFans == 1 && iCompl1 )
                pCut1->Fans[0] = Abc_LitNot(pCut1->Fans[0]);
            // create new cut
            if ( iFan0 >= iFan1 )
                Amap_ManCutCreate( p, pCut0, pCut1, p->pMatsTemp[iFan1] );
            else
                Amap_ManCutCreate( p, pCut1, pCut0, p->pMatsTemp[iFan1] );
            // uncomplement literals
            if ( pCut1->nFans == 1 && iCompl1 )
                pCut1->Fans[0] = Abc_LitNot(pCut1->Fans[0]);
        }
        // uncomplement literals
        if ( pCut0->nFans == 1 && iCompl0 )
            pCut0->Fans[0] = Abc_LitNot(pCut0->Fans[0]);
        // label resulting sets
        for ( i = 0; (Entry = pRules[iFan0][i]); i++ )
            p->pMatsTemp[Entry & 0xffff] = 0;
    }
    Amap_ManCutSaveStored( p, pNode );
    p->nCutsUsed += pNode->nCuts;
    p->nCutsTried += pFanin0->nCuts * pFanin1->nCuts;
//    assert( (int)pNode->nCuts == Amap_ManMergeCountCuts(p, pNode) );
    if ( pNode->fRepr )
        Amap_ManMergeNodeChoice( p, pNode );

//    Amap_ManPrintCuts( pNode );
}